

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O2

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::BasicRateTargetingSVC3TL3SLTest
          (DatarateTestSVC *this)

{
  double *val1;
  bool bVar1;
  ParamType *pPVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  SEARCH_METHODS *pSVar6;
  long lVar7;
  AssertHelper local_c0;
  AssertHelper local_b8;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 1000;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x3f;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_error_resilient = 0;
  std::__cxx11::string::string
            ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv",
             (allocator *)&local_c0);
  libaom_test::I420VideoSource::I420VideoSource
            (&video,(string *)&gtest_fatal_failure_checker,0x160,0x120,0x1e,1,0,300);
  std::__cxx11::string::~string((string *)&gtest_fatal_failure_checker);
  pPVar2 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
           ::GetParam();
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate =
       *(uint *)(&DAT_00ad4878 +
                (long)(pPVar2->
                      super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                      ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_unsigned_int,_int>.
                      super__Tuple_impl<2UL,_int,_unsigned_int,_int>.
                      super__Tuple_impl<3UL,_unsigned_int,_int>.super__Tuple_impl<4UL,_int>.
                      super__Head_base<4UL,_int,_false>._M_head_impl * 4);
  (*(this->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
    super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
    .super_Test._vptr_Test[8])(this);
  this->number_temporal_layers_ = 3;
  this->number_spatial_layers_ = 3;
  uVar3 = (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate;
  this->target_layer_bitrate_[0] = uVar3 >> 4;
  this->target_layer_bitrate_[1] = ((uVar3 >> 3) * 0x46) / 100;
  this->target_layer_bitrate_[2] = uVar3 >> 3;
  uVar5 = uVar3 * 3 >> 3;
  this->target_layer_bitrate_[3] = uVar3 * 3 >> 4;
  this->target_layer_bitrate_[4] = (uVar5 * 0x46) / 100;
  this->target_layer_bitrate_[5] = uVar5;
  uVar3 = uVar3 >> 1 & 0x1fffffff;
  this->target_layer_bitrate_[6] = uVar3 >> 1;
  this->target_layer_bitrate_[7] = (uVar3 * 0x46) / 100;
  this->target_layer_bitrate_[8] = uVar3;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(this->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[2])
                (&this->super_DatarateTest,&video);
    }
    bVar1 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar1 == false) {
      lVar7 = 0;
      for (lVar4 = 0;
          lVar4 < (long)this->number_spatial_layers_ * (long)this->number_temporal_layers_;
          lVar4 = lVar4 + 1) {
        val1 = (double *)((long)this->effective_datarate_tl + lVar7);
        local_c0.data_ = (AssertHelperData *)((double)this->target_layer_bitrate_[lVar4] * 0.5);
        testing::internal::CmpHelperGE<double,double>
                  ((internal *)&gtest_fatal_failure_checker,"effective_datarate_tl[i]",
                   "target_layer_bitrate_[i] * 0.50",val1,(double *)&local_c0);
        if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface == '\0') {
          testing::Message::Message((Message *)&local_c0);
          std::operator<<((ostream *)&(local_c0.data_)->line,
                          " The datarate for the file is lower than target by too much!");
          if ((undefined8 *)
              CONCAT71(gtest_fatal_failure_checker._9_7_,
                       gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
            pSVar6 = "";
          }
          else {
            pSVar6 = *(SEARCH_METHODS **)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                     ,0x751,(char *)pSVar6);
          testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_b8);
          if (local_c0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
LAB_0059d6c0:
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
          break;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
        local_c0.data_ = (AssertHelperData *)((double)this->target_layer_bitrate_[lVar4] * 1.38);
        testing::internal::CmpHelperLE<double,double>
                  ((internal *)&gtest_fatal_failure_checker,"effective_datarate_tl[i]",
                   "target_layer_bitrate_[i] * 1.38",val1,(double *)&local_c0);
        if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface == '\0') {
          testing::Message::Message((Message *)&local_c0);
          std::operator<<((ostream *)&(local_c0.data_)->line,
                          " The datarate for the file is greater than target by too much!");
          if ((undefined8 *)
              CONCAT71(gtest_fatal_failure_checker._9_7_,
                       gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
            pSVar6 = "";
          }
          else {
            pSVar6 = *(SEARCH_METHODS **)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                     ,0x753,(char *)pSVar6);
          testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_b8);
          if (local_c0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
          goto LAB_0059d6c0;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
        lVar7 = lVar7 + 8;
      }
      goto LAB_0059d6ca;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_c0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
             ,0x74f,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_c0,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_c0);
  if ((long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                       _vptr_TestPartResultReporterInterface._1_7_,
                       (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                             _vptr_TestPartResultReporterInterface) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface
                                   ._vptr_TestPartResultReporterInterface._1_7_,
                                   (char)gtest_fatal_failure_checker.
                                         super_TestPartResultReporterInterface.
                                         _vptr_TestPartResultReporterInterface) + 8))();
  }
LAB_0059d6ca:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC3TL3SLTest() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 0;

    ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352,
                                         288, 30, 1, 0, 300);
    const int bitrate_array[2] = { 600, 1200 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    number_temporal_layers_ = 3;
    number_spatial_layers_ = 3;
    // SL0
    const int bitrate_sl0 = 1 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[0] = 50 * bitrate_sl0 / 100;
    target_layer_bitrate_[1] = 70 * bitrate_sl0 / 100;
    target_layer_bitrate_[2] = bitrate_sl0;
    // SL1
    const int bitrate_sl1 = 3 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[3] = 50 * bitrate_sl1 / 100;
    target_layer_bitrate_[4] = 70 * bitrate_sl1 / 100;
    target_layer_bitrate_[5] = bitrate_sl1;
    // SL2
    const int bitrate_sl2 = 4 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[6] = 50 * bitrate_sl2 / 100;
    target_layer_bitrate_[7] = 70 * bitrate_sl2 / 100;
    target_layer_bitrate_[8] = bitrate_sl2;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    for (int i = 0; i < number_temporal_layers_ * number_spatial_layers_; i++) {
      ASSERT_GE(effective_datarate_tl[i], target_layer_bitrate_[i] * 0.50)
          << " The datarate for the file is lower than target by too much!";
      ASSERT_LE(effective_datarate_tl[i], target_layer_bitrate_[i] * 1.38)
          << " The datarate for the file is greater than target by too much!";
    }
  }